

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall
ObjectTest_basic_set_forward_list_Test::TestBody(ObjectTest_basic_set_forward_list_Test *this)

{
  undefined8 *puVar1;
  _Fwd_list_node_base *p_Var2;
  _Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  _Var3;
  _Uninitialized<void_*,_true> _Var4;
  _Fwd_list_node_base _Var5;
  pointer *__ptr;
  char *pcVar6;
  object obj;
  _Fwd_list_impl local_98;
  undefined1 local_90 [16];
  _Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_80;
  undefined1 local_78 [16];
  _Fwd_list_node_base local_68 [2];
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_58;
  char local_28;
  
  local_58._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
  local_28 = '\0';
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  local_90._0_8_ = (void *)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Fwd_list_iterator<bool>,std::_Fwd_list_iterator<bool>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Fwd_list_iterator<bool> *)local_78,
             (_Fwd_list_iterator<bool> *)local_90);
  local_90[0] = local_28 == '\x06';
  local_90._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_90,"obj .has< std::forward_list<bool> >()","false")
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x22e,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((_Fwd_list_node_base *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)((long)local_68[0]._M_next + 1));
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<bool,_std::allocator<bool>_>,_std::forward_list<bool,_std::allocator<bool>_>,_nullptr>
            ((object *)local_90,(forward_list<bool,_std::allocator<bool>_> *)&local_58._M_first);
  local_80._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_node_base)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<bool,std::allocator<bool>>,std::forward_list<bool,std::allocator<bool>>>
            ((internal *)local_78,"obj .get< std::forward_list<bool> >()",
             "std::forward_list<bool> {}",(forward_list<bool,_std::allocator<bool>_> *)local_90,
             (forward_list<bool,_std::allocator<bool>_> *)&local_80);
  _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)local_80;
  while (_Var4._M_storage = (void *)local_90._0_8_,
        _Var3._M_impl._M_head._M_next != (_Fwd_list_node_base)0x0) {
    puVar1 = *(undefined8 **)_Var3._M_impl._M_head._M_next;
    operator_delete((void *)_Var3._M_impl._M_head._M_next,0x10);
    _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)puVar1;
  }
  while ((_Fwd_list_node_base *)_Var4._M_storage != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_storage)->_M_next;
    operator_delete(_Var4._M_storage,0x10);
    _Var4._M_storage = p_Var2;
  }
  local_90._0_8_ = (void *)0x0;
  _Var5 = local_98._M_head._M_next;
  while (_Var5._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var5._M_next)->_M_next;
    operator_delete(_Var5._M_next,0x10);
    _Var5._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x22e,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_90._0_8_ != (void *)0x0) {
      (*(code *)(*(_Fwd_list_node_base **)local_90._0_8_)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  local_90._0_8_ = (void *)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Fwd_list_iterator<signed_char>,std::_Fwd_list_iterator<signed_char>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Fwd_list_iterator<signed_char> *)local_78,
             (_Fwd_list_iterator<signed_char> *)local_90);
  local_90[0] = local_28 == '\x06';
  local_90._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_90,"obj .has< std::forward_list<signed char> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x22f,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((_Fwd_list_node_base *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)((long)local_68[0]._M_next + 1));
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<signed_char,_std::allocator<signed_char>_>,_std::forward_list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((object *)local_90,
             (forward_list<signed_char,_std::allocator<signed_char>_> *)&local_58._M_first);
  local_80._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_node_base)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<signed_char,std::allocator<signed_char>>,std::forward_list<signed_char,std::allocator<signed_char>>>
            ((internal *)local_78,"obj .get< std::forward_list<signed char> >()",
             "std::forward_list<signed char> {}",
             (forward_list<signed_char,_std::allocator<signed_char>_> *)local_90,
             (forward_list<signed_char,_std::allocator<signed_char>_> *)&local_80);
  _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)local_80;
  while (_Var4._M_storage = (void *)local_90._0_8_,
        _Var3._M_impl._M_head._M_next != (_Fwd_list_node_base)0x0) {
    puVar1 = *(undefined8 **)_Var3._M_impl._M_head._M_next;
    operator_delete((void *)_Var3._M_impl._M_head._M_next,0x10);
    _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)puVar1;
  }
  while ((_Fwd_list_node_base *)_Var4._M_storage != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_storage)->_M_next;
    operator_delete(_Var4._M_storage,0x10);
    _Var4._M_storage = p_Var2;
  }
  local_90._0_8_ = (void *)0x0;
  _Var5 = local_98._M_head._M_next;
  while (_Var5._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var5._M_next)->_M_next;
    operator_delete(_Var5._M_next,0x10);
    _Var5._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x22f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_90._0_8_ != (void *)0x0) {
      (*(code *)(*(_Fwd_list_node_base **)local_90._0_8_)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  local_90._0_8_ = (void *)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Fwd_list_iterator<unsigned_char>,std::_Fwd_list_iterator<unsigned_char>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Fwd_list_iterator<unsigned_char> *)local_78,
             (_Fwd_list_iterator<unsigned_char> *)local_90);
  local_90[0] = local_28 == '\x06';
  local_90._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_90,"obj .has< std::forward_list<unsigned char> >()"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x230,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((_Fwd_list_node_base *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)((long)local_68[0]._M_next + 1));
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((object *)local_90,
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58._M_first);
  local_80._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_node_base)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<unsigned_char,std::allocator<unsigned_char>>,std::forward_list<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)local_78,"obj .get< std::forward_list<unsigned char> >()",
             "std::forward_list<unsigned char> {}",
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80);
  _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)local_80;
  while (_Var4._M_storage = (void *)local_90._0_8_,
        _Var3._M_impl._M_head._M_next != (_Fwd_list_node_base)0x0) {
    puVar1 = *(undefined8 **)_Var3._M_impl._M_head._M_next;
    operator_delete((void *)_Var3._M_impl._M_head._M_next,0x10);
    _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)puVar1;
  }
  while ((_Fwd_list_node_base *)_Var4._M_storage != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_storage)->_M_next;
    operator_delete(_Var4._M_storage,0x10);
    _Var4._M_storage = p_Var2;
  }
  local_90._0_8_ = (void *)0x0;
  _Var5 = local_98._M_head._M_next;
  while (_Var5._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var5._M_next)->_M_next;
    operator_delete(_Var5._M_next,0x10);
    _Var5._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x230,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_90._0_8_ != (void *)0x0) {
      (*(code *)(*(_Fwd_list_node_base **)local_90._0_8_)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  local_90._0_8_ = (void *)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Fwd_list_iterator<short>,std::_Fwd_list_iterator<short>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Fwd_list_iterator<short> *)local_78,
             (_Fwd_list_iterator<short> *)local_90);
  local_90[0] = local_28 == '\x06';
  local_90._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_90,"obj .has< std::forward_list<short> >()","false"
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x231,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((_Fwd_list_node_base *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)((long)local_68[0]._M_next + 1));
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<short,_std::allocator<short>_>,_std::forward_list<short,_std::allocator<short>_>,_nullptr>
            ((object *)local_90,(forward_list<short,_std::allocator<short>_> *)&local_58._M_first);
  local_80._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_node_base)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<short,std::allocator<short>>,std::forward_list<short,std::allocator<short>>>
            ((internal *)local_78,"obj .get< std::forward_list<short> >()",
             "std::forward_list<short> {}",(forward_list<short,_std::allocator<short>_> *)local_90,
             (forward_list<short,_std::allocator<short>_> *)&local_80);
  _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)local_80;
  while (_Var4._M_storage = (void *)local_90._0_8_,
        _Var3._M_impl._M_head._M_next != (_Fwd_list_node_base)0x0) {
    puVar1 = *(undefined8 **)_Var3._M_impl._M_head._M_next;
    operator_delete((void *)_Var3._M_impl._M_head._M_next,0x10);
    _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)puVar1;
  }
  while ((_Fwd_list_node_base *)_Var4._M_storage != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_storage)->_M_next;
    operator_delete(_Var4._M_storage,0x10);
    _Var4._M_storage = p_Var2;
  }
  local_90._0_8_ = (void *)0x0;
  _Var5 = local_98._M_head._M_next;
  while (_Var5._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var5._M_next)->_M_next;
    operator_delete(_Var5._M_next,0x10);
    _Var5._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x231,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_90._0_8_ != (void *)0x0) {
      (*(code *)(*(_Fwd_list_node_base **)local_90._0_8_)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  local_90._0_8_ = (void *)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Fwd_list_iterator<int>,std::_Fwd_list_iterator<int>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Fwd_list_iterator<int> *)local_78,
             (_Fwd_list_iterator<int> *)local_90);
  local_90[0] = local_28 == '\x06';
  local_90._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_90,"obj .has< std::forward_list<int> >()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x232,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((_Fwd_list_node_base *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)((long)local_68[0]._M_next + 1));
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<int,_std::allocator<int>_>,_std::forward_list<int,_std::allocator<int>_>,_nullptr>
            ((object *)local_90,(forward_list<int,_std::allocator<int>_> *)&local_58._M_first);
  local_80._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_node_base)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<int,std::allocator<int>>,std::forward_list<int,std::allocator<int>>>
            ((internal *)local_78,"obj .get< std::forward_list<int> >()","std::forward_list<int> {}"
             ,(forward_list<int,_std::allocator<int>_> *)local_90,
             (forward_list<int,_std::allocator<int>_> *)&local_80);
  _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)local_80;
  while (_Var4._M_storage = (void *)local_90._0_8_,
        _Var3._M_impl._M_head._M_next != (_Fwd_list_node_base)0x0) {
    puVar1 = *(undefined8 **)_Var3._M_impl._M_head._M_next;
    operator_delete((void *)_Var3._M_impl._M_head._M_next,0x10);
    _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)puVar1;
  }
  while ((_Fwd_list_node_base *)_Var4._M_storage != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_storage)->_M_next;
    operator_delete(_Var4._M_storage,0x10);
    _Var4._M_storage = p_Var2;
  }
  local_90._0_8_ = (void *)0x0;
  _Var5 = local_98._M_head._M_next;
  while (_Var5._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var5._M_next)->_M_next;
    operator_delete(_Var5._M_next,0x10);
    _Var5._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x232,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_90._0_8_ != (void *)0x0) {
      (*(code *)(*(_Fwd_list_node_base **)local_90._0_8_)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  local_90._0_8_ = (void *)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Fwd_list_iterator<long>,std::_Fwd_list_iterator<long>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Fwd_list_iterator<long> *)local_78,
             (_Fwd_list_iterator<long> *)local_90);
  local_90[0] = local_28 == '\x06';
  local_90._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_90,"obj .has< std::forward_list<long> >()","false")
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x233,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((_Fwd_list_node_base *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)((long)local_68[0]._M_next + 1));
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_90,(forward_list<long,_std::allocator<long>_> *)&local_58._M_first);
  local_80._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_node_base)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<long,std::allocator<long>>,std::forward_list<long,std::allocator<long>>>
            ((internal *)local_78,"obj .get< std::forward_list<long> >()",
             "std::forward_list<long> {}",(forward_list<long,_std::allocator<long>_> *)local_90,
             (forward_list<long,_std::allocator<long>_> *)&local_80);
  _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)local_80;
  while (_Var4._M_storage = (void *)local_90._0_8_,
        _Var3._M_impl._M_head._M_next != (_Fwd_list_node_base)0x0) {
    puVar1 = *(undefined8 **)_Var3._M_impl._M_head._M_next;
    operator_delete((void *)_Var3._M_impl._M_head._M_next,0x10);
    _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)puVar1;
  }
  while ((_Fwd_list_node_base *)_Var4._M_storage != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_storage)->_M_next;
    operator_delete(_Var4._M_storage,0x10);
    _Var4._M_storage = p_Var2;
  }
  local_90._0_8_ = (void *)0x0;
  _Var5 = local_98._M_head._M_next;
  while (_Var5._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var5._M_next)->_M_next;
    operator_delete(_Var5._M_next,0x10);
    _Var5._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x233,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_90._0_8_ != (void *)0x0) {
      (*(code *)(*(_Fwd_list_node_base **)local_90._0_8_)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  local_90._0_8_ = (void *)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Fwd_list_iterator<long_long>,std::_Fwd_list_iterator<long_long>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Fwd_list_iterator<long_long> *)local_78,
             (_Fwd_list_iterator<long_long> *)local_90);
  local_90[0] = local_28 == '\x06';
  local_90._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_90,"obj .has< std::forward_list<long long> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x234,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((_Fwd_list_node_base *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)((long)local_68[0]._M_next + 1));
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<long_long,_std::allocator<long_long>_>,_std::forward_list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((object *)local_90,
             (forward_list<long_long,_std::allocator<long_long>_> *)&local_58._M_first);
  local_80._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_node_base)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<long_long,std::allocator<long_long>>,std::forward_list<long_long,std::allocator<long_long>>>
            ((internal *)local_78,"obj .get< std::forward_list<long long> >()",
             "std::forward_list<long long> {}",
             (forward_list<long_long,_std::allocator<long_long>_> *)local_90,
             (forward_list<long_long,_std::allocator<long_long>_> *)&local_80);
  _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)local_80;
  while (_Var4._M_storage = (void *)local_90._0_8_,
        _Var3._M_impl._M_head._M_next != (_Fwd_list_node_base)0x0) {
    puVar1 = *(undefined8 **)_Var3._M_impl._M_head._M_next;
    operator_delete((void *)_Var3._M_impl._M_head._M_next,0x10);
    _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)puVar1;
  }
  while ((_Fwd_list_node_base *)_Var4._M_storage != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_storage)->_M_next;
    operator_delete(_Var4._M_storage,0x10);
    _Var4._M_storage = p_Var2;
  }
  local_90._0_8_ = (void *)0x0;
  _Var5 = local_98._M_head._M_next;
  while (_Var5._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var5._M_next)->_M_next;
    operator_delete(_Var5._M_next,0x10);
    _Var5._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x234,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_90._0_8_ != (void *)0x0) {
      (*(code *)(*(_Fwd_list_node_base **)local_90._0_8_)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  local_90._0_8_ = (void *)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Fwd_list_iterator<long>,std::_Fwd_list_iterator<long>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Fwd_list_iterator<long> *)local_78,
             (_Fwd_list_iterator<long> *)local_90);
  local_90[0] = local_28 == '\x06';
  local_90._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_90,"obj .has< std::forward_list<intmax_t> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x235,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((_Fwd_list_node_base *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)((long)local_68[0]._M_next + 1));
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_90,(forward_list<long,_std::allocator<long>_> *)&local_58._M_first);
  local_80._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_node_base)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<long,std::allocator<long>>,std::forward_list<long,std::allocator<long>>>
            ((internal *)local_78,"obj .get< std::forward_list<intmax_t> >()",
             "std::forward_list<intmax_t> {}",(forward_list<long,_std::allocator<long>_> *)local_90,
             (forward_list<long,_std::allocator<long>_> *)&local_80);
  _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)local_80;
  while (_Var4._M_storage = (void *)local_90._0_8_,
        _Var3._M_impl._M_head._M_next != (_Fwd_list_node_base)0x0) {
    puVar1 = *(undefined8 **)_Var3._M_impl._M_head._M_next;
    operator_delete((void *)_Var3._M_impl._M_head._M_next,0x10);
    _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)puVar1;
  }
  while ((_Fwd_list_node_base *)_Var4._M_storage != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_storage)->_M_next;
    operator_delete(_Var4._M_storage,0x10);
    _Var4._M_storage = p_Var2;
  }
  local_90._0_8_ = (void *)0x0;
  _Var5 = local_98._M_head._M_next;
  while (_Var5._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var5._M_next)->_M_next;
    operator_delete(_Var5._M_next,0x10);
    _Var5._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x235,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_90._0_8_ != (void *)0x0) {
      (*(code *)(*(_Fwd_list_node_base **)local_90._0_8_)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  local_90._0_8_ = (void *)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Fwd_list_iterator<float>,std::_Fwd_list_iterator<float>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Fwd_list_iterator<float> *)local_78,
             (_Fwd_list_iterator<float> *)local_90);
  local_90[0] = local_28 == '\x06';
  local_90._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_90,"obj .has< std::forward_list<float> >()","false"
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x236,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((_Fwd_list_node_base *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)((long)local_68[0]._M_next + 1));
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<float,_std::allocator<float>_>,_std::forward_list<float,_std::allocator<float>_>,_nullptr>
            ((object *)local_90,(forward_list<float,_std::allocator<float>_> *)&local_58._M_first);
  local_80._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_node_base)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<float,std::allocator<float>>,std::forward_list<float,std::allocator<float>>>
            ((internal *)local_78,"obj .get< std::forward_list<float> >()",
             "std::forward_list<float> {}",(forward_list<float,_std::allocator<float>_> *)local_90,
             (forward_list<float,_std::allocator<float>_> *)&local_80);
  _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)local_80;
  while (_Var4._M_storage = (void *)local_90._0_8_,
        _Var3._M_impl._M_head._M_next != (_Fwd_list_node_base)0x0) {
    puVar1 = *(undefined8 **)_Var3._M_impl._M_head._M_next;
    operator_delete((void *)_Var3._M_impl._M_head._M_next,0x10);
    _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)puVar1;
  }
  while ((_Fwd_list_node_base *)_Var4._M_storage != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_storage)->_M_next;
    operator_delete(_Var4._M_storage,0x10);
    _Var4._M_storage = p_Var2;
  }
  local_90._0_8_ = (void *)0x0;
  _Var5 = local_98._M_head._M_next;
  while (_Var5._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var5._M_next)->_M_next;
    operator_delete(_Var5._M_next,0x10);
    _Var5._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x236,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_90._0_8_ != (void *)0x0) {
      (*(code *)(*(_Fwd_list_node_base **)local_90._0_8_)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  local_90._0_8_ = (void *)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Fwd_list_iterator<double>,std::_Fwd_list_iterator<double>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Fwd_list_iterator<double> *)local_78,
             (_Fwd_list_iterator<double> *)local_90);
  local_90[0] = local_28 == '\x06';
  local_90._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_90,"obj .has< std::forward_list<double> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x237,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((_Fwd_list_node_base *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)((long)local_68[0]._M_next + 1));
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<double,_std::allocator<double>_>,_std::forward_list<double,_std::allocator<double>_>,_nullptr>
            ((object *)local_90,(forward_list<double,_std::allocator<double>_> *)&local_58._M_first)
  ;
  local_80._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_node_base)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<double,std::allocator<double>>,std::forward_list<double,std::allocator<double>>>
            ((internal *)local_78,"obj .get< std::forward_list<double> >()",
             "std::forward_list<double> {}",
             (forward_list<double,_std::allocator<double>_> *)local_90,
             (forward_list<double,_std::allocator<double>_> *)&local_80);
  _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)local_80;
  while (_Var4._M_storage = (void *)local_90._0_8_,
        _Var3._M_impl._M_head._M_next != (_Fwd_list_node_base)0x0) {
    puVar1 = *(undefined8 **)_Var3._M_impl._M_head._M_next;
    operator_delete((void *)_Var3._M_impl._M_head._M_next,0x10);
    _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)puVar1;
  }
  while ((_Fwd_list_node_base *)_Var4._M_storage != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_storage)->_M_next;
    operator_delete(_Var4._M_storage,0x10);
    _Var4._M_storage = p_Var2;
  }
  local_90._0_8_ = (void *)0x0;
  _Var5 = local_98._M_head._M_next;
  while (_Var5._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var5._M_next)->_M_next;
    operator_delete(_Var5._M_next,0x10);
    _Var5._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x237,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_90._0_8_ != (void *)0x0) {
      (*(code *)(*(_Fwd_list_node_base **)local_90._0_8_)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  local_90._0_8_ = (void *)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Fwd_list_iterator<long_double>,std::_Fwd_list_iterator<long_double>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Fwd_list_iterator<long_double> *)local_78,
             (_Fwd_list_iterator<long_double> *)local_90);
  local_90[0] = local_28 == '\x06';
  local_90._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_90,"obj .has< std::forward_list<long double> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x238,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((_Fwd_list_node_base *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)((long)local_68[0]._M_next + 1));
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<long_double,_std::allocator<long_double>_>,_std::forward_list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((object *)local_90,
             (forward_list<long_double,_std::allocator<long_double>_> *)&local_58._M_first);
  local_80._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_node_base)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<long_double,std::allocator<long_double>>,std::forward_list<long_double,std::allocator<long_double>>>
            ((internal *)local_78,"obj .get< std::forward_list<long double> >()",
             "std::forward_list<long double> {}",
             (forward_list<long_double,_std::allocator<long_double>_> *)local_90,
             (forward_list<long_double,_std::allocator<long_double>_> *)&local_80);
  _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)local_80;
  while (_Var4._M_storage = (void *)local_90._0_8_,
        _Var3._M_impl._M_head._M_next != (_Fwd_list_node_base)0x0) {
    puVar1 = *(undefined8 **)_Var3._M_impl._M_head._M_next;
    operator_delete((void *)_Var3._M_impl._M_head._M_next,0x20);
    _Var3._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_impl)puVar1;
  }
  while ((_Fwd_list_node_base *)_Var4._M_storage != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var4._M_storage)->_M_next;
    operator_delete(_Var4._M_storage,0x20);
    _Var4._M_storage = p_Var2;
  }
  local_90._0_8_ = (void *)0x0;
  _Var5 = local_98._M_head._M_next;
  while (_Var5._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = (_Var5._M_next)->_M_next;
    operator_delete(_Var5._M_next,0x20);
    _Var5._M_next = p_Var2;
  }
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x238,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_90._0_8_ != (void *)0x0) {
      (*(code *)(*(_Fwd_list_node_base **)local_90._0_8_)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  local_90._0_8_ = (void *)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::
  emplace<6ul,std::_Fwd_list_iterator<std::__cxx11::u8string>,std::_Fwd_list_iterator<std::__cxx11::u8string>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,
             (_Fwd_list_iterator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
              *)local_78,
             (_Fwd_list_iterator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
              *)local_90);
  std::
  _Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                     *)&local_98);
  local_90[0] = local_28 == '\x06';
  local_90._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_90,"obj .has< std::forward_list<std::u8string> >()"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x239,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((_Fwd_list_node_base *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)((long)local_68[0]._M_next + 1));
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((object *)local_90,
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_58._M_first);
  local_80._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_node_base)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>,std::forward_list<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
            ((internal *)local_78,"obj .get< std::forward_list<std::u8string> >()",
             "std::forward_list<std::u8string> {}",
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_90,
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_80);
  std::
  _Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Fwd_list_base(&local_80);
  std::
  _Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                     *)local_90);
  std::
  _Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                     *)&local_98);
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_90);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_78._8_8_ ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x239,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_90._0_8_ != (void *)0x0) {
      (*(code *)(*(_Fwd_list_node_base **)local_90._0_8_)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  local_78._0_8_ = (_Fwd_list_node_base *)0x0;
  local_90._0_8_ = (void *)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::_Fwd_list_iterator<jessilib::object>,std::_Fwd_list_iterator<jessilib::object>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_58._M_first,(_Fwd_list_iterator<jessilib::object> *)local_78,
             (_Fwd_list_iterator<jessilib::object> *)local_90);
  std::_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_>::~_Fwd_list_base
            ((_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_> *)&local_98);
  local_90[0] = local_28 == '\x06';
  local_90._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28 != '\x06') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_90,"obj .has< std::forward_list<object> >()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x23a,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((_Fwd_list_node_base *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)((long)local_68[0]._M_next + 1));
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)local_90,
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_58._M_first
            );
  local_80._M_impl._M_head._M_next = (_Fwd_list_impl)(_Fwd_list_node_base)0x0;
  testing::internal::
  CmpHelperEQ<std::forward_list<jessilib::object,std::allocator<jessilib::object>>,std::forward_list<jessilib::object,std::allocator<jessilib::object>>>
            ((internal *)local_78,"obj .get< std::forward_list<object> >()",
             "std::forward_list<object> {}",
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)local_90,
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_80);
  std::_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_>::~_Fwd_list_base
            ((_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_> *)&local_80);
  std::_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_>::~_Fwd_list_base
            ((_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_> *)local_90);
  std::_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_>::~_Fwd_list_base
            ((_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_> *)&local_98);
  if ((bool)local_78[0] == false) {
    testing::Message::Message((Message *)local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x23a,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((void *)local_90._0_8_ != (void *)0x0) {
      (*(code *)(*(_Fwd_list_node_base **)local_90._0_8_)[1]._M_next)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_
                );
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_58._M_first);
  return;
}

Assistant:

TEST(ObjectTest, basic_set_forward_list) {
	object obj;

	OBJECT_BASIC_SET_TEST(obj, std::forward_list<bool>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<signed char>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<unsigned char>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<short>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<int>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<long>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<long long>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<intmax_t>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<float>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<double>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<long double>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<std::u8string>);
	OBJECT_BASIC_SET_TEST(obj, std::forward_list<object>);
}